

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

void __thiscall AActor::Thrust(AActor *this)

{
  double dVar1;
  double dVar2;
  AActor *this_local;
  
  dVar1 = this->Speed;
  dVar2 = TAngle<double>::Cos(&(this->Angles).Yaw);
  (this->Vel).X = dVar1 * dVar2 + (this->Vel).X;
  dVar1 = this->Speed;
  dVar2 = TAngle<double>::Sin(&(this->Angles).Yaw);
  (this->Vel).Y = dVar1 * dVar2 + (this->Vel).Y;
  return;
}

Assistant:

void Thrust()
	{
		Vel.X += Speed * Angles.Yaw.Cos();
		Vel.Y += Speed * Angles.Yaw.Sin();
	}